

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O0

void __thiscall
Function_Pool::FunctionPoolTask::_setup
          (FunctionPoolTask *this,Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,
          uint32_t startX2,uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,
          uint32_t width,uint32_t height)

{
  bool bVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  AbstractTaskProvider *in_RDI;
  undefined8 in_stack_00000010;
  uint32_t in_stack_00000018;
  undefined4 in_stack_00000020;
  undefined4 in_stack_00000028;
  pointer pIVar4;
  uint32_t uVar5;
  pointer __p;
  uint32_t in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef4;
  uint32_t in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  uint32_t in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff40;
  uint32_t in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff50;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff08,
             (ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),in_stack_ffffffffffffff38
             ,in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,in_stack_ffffffffffffff50);
  bVar1 = AbstractTaskProvider::_ready(in_RDI);
  if (!bVar1) {
    uVar3 = __cxa_allocate_exception(0x28);
    imageException::imageException
              ((imageException *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    __cxa_throw(uVar3,&imageException::typeinfo,imageException::~imageException);
  }
  operator_new(0x68);
  uVar2 = anon_unknown.dwarf_65d18::threadCount();
  pIVar4 = (pointer)CONCAT44(in_stack_00000010._4_4_,uVar2);
  InputImageInfo::InputImageInfo
            ((InputImageInfo *)CONCAT44(in_stack_fffffffffffffef4,in_stack_00000028),
             (Image *)CONCAT44(in_stack_fffffffffffffeec,in_stack_00000020),
             in_stack_fffffffffffffee4,in_stack_00000018,in_stack_00000010._4_4_,uVar2,
             in_stack_ffffffffffffff00);
  std::unique_ptr<Function_Pool::InputImageInfo,std::default_delete<Function_Pool::InputImageInfo>>
  ::unique_ptr<std::default_delete<Function_Pool::InputImageInfo>,void>
            ((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
              *)CONCAT44(in_stack_fffffffffffffee4,in_stack_00000018),pIVar4);
  std::
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
  operator=((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             *)CONCAT44(in_stack_fffffffffffffee4,in_stack_00000018),
            (unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             *)pIVar4);
  uVar5 = (uint32_t)((ulong)pIVar4 >> 0x20);
  std::
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
  ~unique_ptr((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
               *)CONCAT44(in_stack_fffffffffffffee4,in_stack_00000018));
  operator_new(0x68);
  uVar2 = anon_unknown.dwarf_65d18::threadCount();
  pIVar4 = (pointer)CONCAT44(uVar5,uVar2);
  InputImageInfo::InputImageInfo
            ((InputImageInfo *)CONCAT44(in_stack_fffffffffffffef4,in_stack_00000028),
             (Image *)CONCAT44(in_stack_fffffffffffffeec,in_stack_00000020),
             in_stack_fffffffffffffee4,in_stack_00000018,uVar5,uVar2,in_stack_ffffffffffffff00);
  std::unique_ptr<Function_Pool::InputImageInfo,std::default_delete<Function_Pool::InputImageInfo>>
  ::unique_ptr<std::default_delete<Function_Pool::InputImageInfo>,void>
            ((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
              *)CONCAT44(in_stack_fffffffffffffee4,in_stack_00000018),pIVar4);
  std::
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
  operator=((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             *)CONCAT44(in_stack_fffffffffffffee4,in_stack_00000018),
            (unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             *)pIVar4);
  uVar5 = (uint32_t)((ulong)pIVar4 >> 0x20);
  std::
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
  ~unique_ptr((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
               *)CONCAT44(in_stack_fffffffffffffee4,in_stack_00000018));
  operator_new(0x68);
  uVar2 = anon_unknown.dwarf_65d18::threadCount();
  __p = (pointer)CONCAT44(uVar5,uVar2);
  OutputImageInfo::OutputImageInfo
            ((OutputImageInfo *)CONCAT44(in_stack_fffffffffffffef4,in_stack_00000028),
             (Image *)CONCAT44(in_stack_fffffffffffffeec,in_stack_00000020),
             in_stack_fffffffffffffee4,in_stack_00000018,uVar5,uVar2,in_stack_ffffffffffffff00);
  std::
  unique_ptr<Function_Pool::OutputImageInfo,std::default_delete<Function_Pool::OutputImageInfo>>::
  unique_ptr<std::default_delete<Function_Pool::OutputImageInfo>,void>
            ((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
              *)CONCAT44(in_stack_fffffffffffffee4,in_stack_00000018),__p);
  std::
  unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>::
  operator=((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             *)CONCAT44(in_stack_fffffffffffffee4,in_stack_00000018),
            (unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             *)__p);
  std::
  unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>::
  ~unique_ptr((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
               *)CONCAT44(in_stack_fffffffffffffee4,in_stack_00000018));
  return;
}

Assistant:

void FunctionPoolTask::_setup( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                                   Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height )
    {
        Image_Function::ParameterValidation( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );

        if( !_ready() )
            throw imageException( "FunctionTask object was called multiple times!" );

        _infoIn1 = std::unique_ptr < InputImageInfo  >( new InputImageInfo ( in1, startX1, startY1, width, height, threadCount() ) );
        _infoIn2 = std::unique_ptr < InputImageInfo  >( new InputImageInfo ( in2, startX2, startY2, width, height, threadCount() ) );
        _infoOut = std::unique_ptr < OutputImageInfo >( new OutputImageInfo( out, startXOut, startYOut, width, height, threadCount() ) );
    }